

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UColAttributeValue __thiscall
icu_63::RuleBasedCollator::getAttribute
          (RuleBasedCollator *this,UColAttribute attr,UErrorCode *errorCode)

{
  UBool UVar1;
  uint local_2c;
  int32_t option;
  UErrorCode *errorCode_local;
  UColAttribute attr_local;
  RuleBasedCollator *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 != '\0') {
    return UCOL_DEFAULT;
  }
  switch(attr) {
  case UCOL_FRENCH_COLLATION:
    local_2c = 0x800;
    goto LAB_0028aead;
  case UCOL_ALTERNATE_HANDLING:
    this_local._4_4_ = CollationSettings::getAlternateHandling(this->settings);
    break;
  case UCOL_CASE_FIRST:
    this_local._4_4_ = CollationSettings::getCaseFirst(this->settings);
    break;
  case UCOL_CASE_LEVEL:
    local_2c = 0x400;
    goto LAB_0028aead;
  case UCOL_DECOMPOSITION_MODE:
    local_2c = 1;
    goto LAB_0028aead;
  case UCOL_STRENGTH:
    this_local._4_4_ = CollationSettings::getStrength(this->settings);
    break;
  case UCOL_HIRAGANA_QUATERNARY_MODE:
    this_local._4_4_ = UCOL_OFF;
    break;
  case UCOL_NUMERIC_COLLATION:
    local_2c = 2;
LAB_0028aead:
    this_local._4_4_ = UCOL_ON;
    if ((this->settings->options & local_2c) == 0) {
      this_local._4_4_ = UCOL_OFF;
    }
    break;
  default:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    this_local._4_4_ = UCOL_DEFAULT;
  }
  return this_local._4_4_;
}

Assistant:

UColAttributeValue
RuleBasedCollator::getAttribute(UColAttribute attr, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return UCOL_DEFAULT; }
    int32_t option;
    switch(attr) {
    case UCOL_FRENCH_COLLATION:
        option = CollationSettings::BACKWARD_SECONDARY;
        break;
    case UCOL_ALTERNATE_HANDLING:
        return settings->getAlternateHandling();
    case UCOL_CASE_FIRST:
        return settings->getCaseFirst();
    case UCOL_CASE_LEVEL:
        option = CollationSettings::CASE_LEVEL;
        break;
    case UCOL_NORMALIZATION_MODE:
        option = CollationSettings::CHECK_FCD;
        break;
    case UCOL_STRENGTH:
        return (UColAttributeValue)settings->getStrength();
    case UCOL_HIRAGANA_QUATERNARY_MODE:
        // Deprecated attribute, unsettable.
        return UCOL_OFF;
    case UCOL_NUMERIC_COLLATION:
        option = CollationSettings::NUMERIC;
        break;
    default:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return UCOL_DEFAULT;
    }
    return ((settings->options & option) == 0) ? UCOL_OFF : UCOL_ON;
}